

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void QPDFObjectHandle::parseContentStream_data
               (shared_ptr<Buffer> *stream_data,string *description,ParserCallbacks *callbacks,
               QPDF *context)

{
  pointer *ppQVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *i;
  qpdf_offset_t qVar5;
  qpdf_offset_t qVar6;
  type ii;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_t __nbytes;
  long i_00;
  char ch;
  QPDFObjectHandle obj;
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  sp_description;
  Tokenizer tokenizer;
  BufferInputSource input;
  undefined1 local_301;
  string *local_300;
  undefined1 local_2f8 [32];
  string local_2d8;
  InputSource *local_2b8;
  pointer local_2b0;
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  local_2a8;
  undefined1 local_298 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [128];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  Tokenizer local_1b0;
  BufferInputSource local_118;
  
  local_2f8._16_8_ = callbacks;
  local_2f8._24_8_ = context;
  local_268._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       Buffer::getSize((stream_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  local_300 = description;
  BufferInputSource::BufferInputSource
            (&local_118,description,
             (stream_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,false);
  ::qpdf::Tokenizer::Tokenizer(&local_1b0);
  ::qpdf::Tokenizer::allowEOF(&local_1b0);
  local_250._0_8_ = (pointer)local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"content","");
  QPDFParser::make_description((QPDFParser *)local_298,local_300,(string *)local_250);
  if ((pointer)local_250._0_8_ != (pointer)local_240) {
    operator_delete((void *)local_250._0_8_,(ulong)(local_240._0_8_ + 1));
  }
  do {
    i = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BufferInputSource::tell(&local_118);
    if ((long)i < 0) {
      QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error((longlong)i);
    }
    if (local_268._M_pi <= i) break;
    local_250._0_8_ = (pointer)local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"content","");
    ::qpdf::Tokenizer::nextToken(&local_1b0,&local_118.super_InputSource,(string *)local_250,1);
    if ((pointer)local_250._0_8_ != (pointer)local_240) {
      operator_delete((void *)local_250._0_8_,(ulong)(local_240._0_8_ + 1));
    }
    qVar5 = InputSource::getLastOffset(&local_118.super_InputSource);
    BufferInputSource::seek(&local_118,qVar5,0);
    local_2a8.
    super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_298._0_8_;
    local_2a8.
    super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_;
    if ((pointer)local_298._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppQVar1 = &(((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_298._8_8_)
                   ->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppQVar1 = *(int *)ppQVar1 + 1;
        UNLOCK();
      }
      else {
        ppQVar1 = &(((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_298._8_8_)
                   ->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppQVar1 = *(int *)ppQVar1 + 1;
      }
    }
    QPDFParser::parse_content
              ((QPDFParser *)local_2f8,&local_118.super_InputSource,&local_2a8,&local_1b0,
               (QPDF *)local_2f8._24_8_);
    if ((pointer)local_2a8.
                 super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a8.
                 super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    uVar2 = local_2f8._0_8_;
    if ((InputSource *)local_2f8._0_8_ != (InputSource *)0x0) {
      qVar6 = BufferInputSource::tell(&local_118);
      __nbytes = qVar6 - qVar5;
      if ((long)__nbytes < 0) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(__nbytes);
      }
      local_2b8 = (InputSource *)local_2f8._0_8_;
      local_2b0 = (pointer)local_2f8._8_8_;
      if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_2f8._8_8_ + 8) = *(int *)(local_2f8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_2f8._8_8_ + 8) = *(int *)(local_2f8._8_8_ + 8) + 1;
        }
      }
      if (qVar5 < 0) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(qVar5);
      }
      (*(*(_func_int ***)local_2f8._16_8_)[3])(local_2f8._16_8_,&local_2b8,qVar5);
      if (local_2b0 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0);
      }
      bVar3 = isOperator((QPDFObjectHandle *)local_2f8);
      if (bVar3) {
        getOperatorValue_abi_cxx11_((string *)(local_240 + 0x70),(QPDFObjectHandle *)local_2f8);
        iVar4 = std::__cxx11::string::compare((char *)(local_240 + 0x70));
        bVar3 = iVar4 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._112_8_ != &local_1c0) {
          operator_delete((void *)local_240._112_8_,local_1c0._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if (bVar3) {
        BufferInputSource::read(&local_118,(int)&local_301,(void *)0x1,__nbytes);
        ::qpdf::Tokenizer::expectInlineImage(&local_1b0,&local_118.super_InputSource);
        ::qpdf::Tokenizer::nextToken(&local_1b0,&local_118.super_InputSource,local_300,0);
        qVar5 = InputSource::getLastOffset(&local_118.super_InputSource);
        qVar6 = BufferInputSource::tell(&local_118);
        i_00 = qVar6 - qVar5;
        if (i_00 < 0) {
          QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i_00);
        }
        args = &local_1b0.val;
        if ((local_1b0.type != tt_string) && (local_1b0.type != tt_name)) {
          if (local_1b0.type == tt_bad) {
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_2f8 + 0x20),"stream data","");
            qVar5 = BufferInputSource::tell(&local_118);
            local_298._16_8_ = &local_278;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_298 + 0x10),"EOF found while reading inline image","");
            QPDFExc::QPDFExc((QPDFExc *)local_250,qpdf_e_damaged_pdf,local_300,
                             (string *)(local_2f8 + 0x20),qVar5,(string *)(local_298 + 0x10));
            warn((QPDF *)local_2f8._24_8_,(QPDFExc *)local_250);
            QPDFExc::~QPDFExc((QPDFExc *)local_250);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._16_8_ != &local_278) {
              operator_delete((void *)local_298._16_8_,(ulong)(local_278._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,
                              (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
            }
            goto LAB_001c8c00;
          }
          args = &local_1b0.raw_val;
        }
        QPDFObject::create<QPDF_InlineImage,std::__cxx11::string_const&>
                  ((QPDFObject *)local_250,args);
        local_260._0_4_ = local_250._0_4_;
        local_260._4_4_ = local_250._4_4_;
        local_260._8_4_ = local_250._8_4_;
        local_260._12_4_ = local_250._12_4_;
        if (qVar5 < 0) {
          QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(qVar5);
        }
        (*(*(_func_int ***)local_2f8._16_8_)[3])(local_2f8._16_8_,local_260,qVar5,i_00);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_260._12_4_,local_260._8_4_) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_260._12_4_,local_260._8_4_));
        }
      }
    }
LAB_001c8c00:
    if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
    }
  } while ((InputSource *)uVar2 != (InputSource *)0x0);
  if ((pointer)local_298._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.error_message._M_dataplus._M_p != &local_1b0.error_message.field_2) {
    operator_delete(local_1b0.error_message._M_dataplus._M_p,
                    local_1b0.error_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.raw_val._M_dataplus._M_p != &local_1b0.raw_val.field_2) {
    operator_delete(local_1b0.raw_val._M_dataplus._M_p,
                    local_1b0.raw_val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.val._M_dataplus._M_p != &local_1b0.val.field_2) {
    operator_delete(local_1b0.val._M_dataplus._M_p,local_1b0.val.field_2._M_allocated_capacity + 1);
  }
  BufferInputSource::~BufferInputSource(&local_118);
  return;
}

Assistant:

void
QPDFObjectHandle::parseContentStream_data(
    std::shared_ptr<Buffer> stream_data,
    std::string const& description,
    ParserCallbacks* callbacks,
    QPDF* context)
{
    size_t stream_length = stream_data->getSize();
    auto input = BufferInputSource(description, stream_data.get());
    Tokenizer tokenizer;
    tokenizer.allowEOF();
    auto sp_description = QPDFParser::make_description(description, "content");
    while (QIntC::to_size(input.tell()) < stream_length) {
        // Read a token and seek to the beginning. The offset we get from this process is the
        // beginning of the next non-ignorable (space, comment) token. This way, the offset and
        // don't including ignorable content.
        tokenizer.nextToken(input, "content", true);
        qpdf_offset_t offset = input.getLastOffset();
        input.seek(offset, SEEK_SET);
        auto obj = QPDFParser::parse_content(input, sp_description, tokenizer, context);
        if (!obj) {
            // EOF
            break;
        }
        size_t length = QIntC::to_size(input.tell() - offset);

        callbacks->handleObject(obj, QIntC::to_size(offset), length);
        if (obj.isOperator() && (obj.getOperatorValue() == "ID")) {
            // Discard next character; it is the space after ID that terminated the token.  Read
            // until end of inline image.
            char ch;
            input.read(&ch, 1);
            tokenizer.expectInlineImage(input);
            tokenizer.nextToken(input, description);
            offset = input.getLastOffset();
            length = QIntC::to_size(input.tell() - offset);
            if (tokenizer.getType() == QPDFTokenizer::tt_bad) {
                QTC::TC("qpdf", "QPDFObjectHandle EOF in inline image");
                warn(
                    context,
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        description,
                        "stream data",
                        input.tell(),
                        "EOF found while reading inline image"));
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle inline image token");
                callbacks->handleObject(
                    QPDFObjectHandle::newInlineImage(tokenizer.getValue()),
                    QIntC::to_size(offset),
                    length);
            }
        }
    }
}